

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void kurtosis_double_suite::test_same(void)

{
  value_type *pvVar1;
  moment_kurtosis<double> filter;
  value_type local_a0 [2];
  basic_moment<double,_(trial::online::with)4> local_90;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::basic_moment
            (&local_90,0.125,0.25,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&local_90,1.0);
  local_a0[0] = (value_type)
                (-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                super_basic_moment<double,_(trial::online::with)2>.
                                super_basic_moment<double,_(trial::online::with)1>.normalization) &
                (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                        super_basic_moment<double,_(trial::online::with)2>.
                        super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                       local_90.super_basic_moment<double,_(trial::online::with)3>.
                       super_basic_moment<double,_(trial::online::with)2>.
                       super_basic_moment<double,_(trial::online::with)1>.normalization));
  pvVar1 = local_a0 + 1;
  local_a0[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x294,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = (value_type)
                (-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                super_basic_moment<double,_(trial::online::with)2>.normalization) &
                (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                        super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                       local_90.super_basic_moment<double,_(trial::online::with)3>.
                       super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x295,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          (&local_90.super_basic_moment<double,_(trial::online::with)3>);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x296,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                          (&local_90);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x297,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&local_90,1.0);
  local_a0[0] = (value_type)
                (-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                super_basic_moment<double,_(trial::online::with)2>.
                                super_basic_moment<double,_(trial::online::with)1>.normalization) &
                (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                        super_basic_moment<double,_(trial::online::with)2>.
                        super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                       local_90.super_basic_moment<double,_(trial::online::with)3>.
                       super_basic_moment<double,_(trial::online::with)2>.
                       super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x299,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = (value_type)
                (-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                super_basic_moment<double,_(trial::online::with)2>.normalization) &
                (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                        super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                       local_90.super_basic_moment<double,_(trial::online::with)3>.
                       super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29a,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          (&local_90.super_basic_moment<double,_(trial::online::with)3>);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29b,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                          (&local_90);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29c,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push(&local_90,1.0);
  local_a0[0] = (value_type)
                (-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                super_basic_moment<double,_(trial::online::with)2>.
                                super_basic_moment<double,_(trial::online::with)1>.normalization) &
                (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                        super_basic_moment<double,_(trial::online::with)2>.
                        super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                       local_90.super_basic_moment<double,_(trial::online::with)3>.
                       super_basic_moment<double,_(trial::online::with)2>.
                       super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29e,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = (value_type)
                (-(ulong)(0.0 < local_90.super_basic_moment<double,_(trial::online::with)3>.
                                super_basic_moment<double,_(trial::online::with)2>.normalization) &
                (ulong)(local_90.super_basic_moment<double,_(trial::online::with)3>.
                        super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                       local_90.super_basic_moment<double,_(trial::online::with)3>.
                       super_basic_moment<double,_(trial::online::with)2>.normalization));
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x29f,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          (&local_90.super_basic_moment<double,_(trial::online::with)3>);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2a0,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                          (&local_90);
  local_a0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2a1,"void kurtosis_double_suite::test_same()",local_a0,pvVar1);
  return;
}

Assistant:

void test_same()
{
    decay::moment_kurtosis<double> filter(one_over_eight, one_over_four, one_over_four, one_over_four);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
}